

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::ProcessPackageResult
          (PeerManagerImpl *this,PackageToValidate *package_to_validate,
          PackageMempoolAcceptResult *package_result)

{
  _Rb_tree_color _Var1;
  NodeId nodeid;
  CRollingBloomFilter *this_00;
  pointer psVar2;
  const_iterator cVar3;
  pointer psVar4;
  CTransactionRef *ptx;
  NodeId *pNVar5;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((package_result->m_state).super_ValidationState<PackageValidationResult>.m_mode == M_INVALID)
  {
    this_00 = RecentRejectsReconsiderableFilter(this);
    GetPackageHash(&local_58,&package_to_validate->m_txns);
    vKey.m_size = 0x20;
    vKey.m_data = (uchar *)&local_58;
    CRollingBloomFilter::insert(this_00,vKey);
  }
  psVar2 = (package_to_validate->m_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (package_to_validate->m_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)psVar4 - (long)psVar2 == 0x20) {
    pNVar5 = (package_to_validate->m_senders).super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      pNVar5 = pNVar5 + -1;
      ptx = psVar4 + -1;
      if (psVar4 == psVar2) break;
      nodeid = *pNVar5;
      cVar3 = std::
              _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::find(&(package_result->m_tx_results)._M_t,
                     &(((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->m_witness_hash).m_wrapped);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &(package_result->m_tx_results)._M_t._M_impl.super__Rb_tree_header) {
        _Var1 = cVar3._M_node[2]._M_color;
        if ((_Var1 == 3) || (_Var1 == _S_black)) {
          ProcessInvalidTx(this,nodeid,ptx,(TxValidationState *)&cVar3._M_node[2]._M_parent,false);
        }
        else if (_Var1 == _S_red) {
          ProcessValidTx(this,nodeid,ptx,
                         (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)&cVar3._M_node[4]._M_left);
        }
      }
      psVar2 = (package_to_validate->m_txns).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = ptx;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessPackageResult(const PackageToValidate& package_to_validate, const PackageMempoolAcceptResult& package_result)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    const auto& package = package_to_validate.m_txns;
    const auto& senders = package_to_validate.m_senders;

    if (package_result.m_state.IsInvalid()) {
        RecentRejectsReconsiderableFilter().insert(GetPackageHash(package));
    }
    // We currently only expect to process 1-parent-1-child packages. Remove if this changes.
    if (!Assume(package.size() == 2)) return;

    // Iterate backwards to erase in-package descendants from the orphanage before they become
    // relevant in AddChildrenToWorkSet.
    auto package_iter = package.rbegin();
    auto senders_iter = senders.rbegin();
    while (package_iter != package.rend()) {
        const auto& tx = *package_iter;
        const NodeId nodeid = *senders_iter;
        const auto it_result{package_result.m_tx_results.find(tx->GetWitnessHash())};

        // It is not guaranteed that a result exists for every transaction.
        if (it_result != package_result.m_tx_results.end()) {
            const auto& tx_result = it_result->second;
            switch (tx_result.m_result_type) {
                case MempoolAcceptResult::ResultType::VALID:
                {
                    ProcessValidTx(nodeid, tx, tx_result.m_replaced_transactions);
                    break;
                }
                case MempoolAcceptResult::ResultType::INVALID:
                case MempoolAcceptResult::ResultType::DIFFERENT_WITNESS:
                {
                    // Don't add to vExtraTxnForCompact, as these transactions should have already been
                    // added there when added to the orphanage or rejected for TX_RECONSIDERABLE.
                    // This should be updated if package submission is ever used for transactions
                    // that haven't already been validated before.
                    ProcessInvalidTx(nodeid, tx, tx_result.m_state, /*maybe_add_extra_compact_tx=*/false);
                    break;
                }
                case MempoolAcceptResult::ResultType::MEMPOOL_ENTRY:
                {
                    // AlreadyHaveTx() should be catching transactions that are already in mempool.
                    Assume(false);
                    break;
                }
            }
        }
        package_iter++;
        senders_iter++;
    }
}